

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

JL_STATUS JlGetStringFromDictionaryByKey
                    (JlDataObject *DictionaryObject,char *KeyName,char **pString)

{
  char *local_38;
  char *stringPtr;
  JlDataObject *object;
  char **ppcStack_20;
  JL_STATUS jlStatus;
  char **pString_local;
  char *KeyName_local;
  JlDataObject *DictionaryObject_local;
  
  if (((DictionaryObject == (JlDataObject *)0x0) || (KeyName == (char *)0x0)) ||
     (pString == (char **)0x0)) {
    object._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    *pString = (char *)0x0;
    stringPtr = (char *)0x0;
    ppcStack_20 = pString;
    pString_local = (char **)KeyName;
    KeyName_local = (char *)DictionaryObject;
    object._4_4_ = JlGetObjectFromDictionaryByKey
                             (DictionaryObject,KeyName,(JlDataObject **)&stringPtr);
    if (object._4_4_ == JL_STATUS_SUCCESS) {
      local_38 = (char *)0x0;
      object._4_4_ = JlGetObjectString((JlDataObject *)stringPtr,&local_38);
      if (object._4_4_ == JL_STATUS_SUCCESS) {
        *ppcStack_20 = local_38;
      }
    }
  }
  return object._4_4_;
}

Assistant:

JL_STATUS
    JlGetStringFromDictionaryByKey
    (
        JlDataObject const*         DictionaryObject,
        char const*                 KeyName,
        char const**                pString
    )
{
    JL_STATUS jlStatus;

    if(     NULL != DictionaryObject
        &&  NULL != KeyName
        &&  NULL != pString )
    {
        *pString = NULL;

        JlDataObject* object = NULL;
        jlStatus = JlGetObjectFromDictionaryByKey( DictionaryObject, KeyName, &object );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            char const* stringPtr = NULL;
            jlStatus = JlGetObjectString( object, &stringPtr );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                *pString = stringPtr;
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}